

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void hexdump(char *data,char *mask,size_t len)

{
  ushort **ppuVar1;
  int j;
  long lVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  int i;
  int iVar8;
  char *pcVar9;
  int local_58;
  
  uVar6 = 0;
  pcVar5 = mask;
  do {
    printf("#%07x: ",(ulong)uVar6);
    iVar8 = 0;
    pcVar4 = pcVar5;
    pcVar9 = data;
    uVar7 = uVar6;
    for (lVar3 = 0; local_58 = (int)len, lVar3 != 8; lVar3 = lVar3 + 1) {
      for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
        if (local_58 <= (int)(uVar7 + (int)lVar2)) goto LAB_0010166b;
        if (mask == (char *)0x0) {
          printf("%02x",(ulong)(byte)pcVar9[lVar2]);
        }
        else {
          if (pcVar4[lVar2] != '\0') {
            printf("%s","\x1b[30;1m");
          }
          printf("%02x",(ulong)(byte)pcVar9[lVar2]);
          if ((mask != (char *)0x0) && (pcVar4[lVar2] != '\0')) {
            printf("%s","\x1b[0m");
          }
        }
        iVar8 = iVar8 + 2;
      }
      putchar(0x20);
      iVar8 = iVar8 + 1;
      pcVar9 = pcVar9 + 2;
      pcVar4 = pcVar4 + 2;
      uVar7 = uVar7 + 2;
    }
LAB_0010166b:
    for (; iVar8 < 0x29; iVar8 = iVar8 + 1) {
      putchar(0x20);
    }
    ppuVar1 = __ctype_b_loc();
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      iVar8 = 0x2e;
      if (((*ppuVar1)[(int)data[lVar3]] >> 0xe & 1) != 0) {
        iVar8 = (int)data[lVar3];
      }
      putchar(iVar8);
    }
    putchar(10);
    uVar6 = uVar6 + 0x10;
    data = data + 0x10;
    pcVar5 = pcVar5 + 0x10;
    if (local_58 <= (int)uVar6) {
      return;
    }
  } while( true );
}

Assistant:

void hexdump(const char *data, const char *mask, size_t len)
{
    const char *bold_gray = "\x1b[30;1m";
    const char *reset      = "\x1b[0m";
    int offset = 0;
    while(1)
    {
        //print line
        printf("#%07x: ", offset);

        int char_covered = 0;

        //print hex groups (8)
        for(int i=0; i<8; ++i) {

            //print doublet
            for(int j=0; j<2; ++j) {
                int loffset = offset + 2*i + j;
                if(loffset >= (int)len)
                    goto escape;

                //print hex
                {
                    //start highlight
                    if(mask && mask[loffset]){printf("%s", bold_gray);}

                    //print chars
                    printf("%02x", 0xff&data[loffset]);

                    //end highlight
                    if(mask && mask[loffset]){printf("%s", reset);}
                    char_covered += 2;
                }
            }
            printf(" ");
            char_covered += 1;
        }
escape:

        //print filler if needed
        for(int i=char_covered; i<41; ++i)
            printf(" ");

        //print ascii (16)
        for(int i=0; i<16; ++i) {
            if(isprint(data[offset+i]))
                printf("%c", data[offset+i]);
            else
                printf(".");
        }
        printf("\n");
        offset += 16;
        if(offset >= (int)len)
            return;
    }
}